

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall Builder::LoadDyndeps(Builder *this,Node *node,string *err)

{
  BuildStatus *this_00;
  bool bVar1;
  int total;
  undefined1 local_58 [8];
  DyndepFile ddf;
  string *err_local;
  Node *node_local;
  Builder *this_local;
  
  ddf.
  super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>.
  _M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)err;
  BuildStatus::BuildLoadDyndeps(this->status_);
  DyndepFile::DyndepFile((DyndepFile *)local_58);
  bVar1 = DependencyScan::LoadDyndeps
                    (&this->scan_,node,(DyndepFile *)local_58,
                     (string *)
                     ddf.
                     super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                     ._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar1) {
    bVar1 = Plan::DyndepsLoaded(&this->plan_,&this->scan_,node,(DyndepFile *)local_58,
                                (string *)
                                ddf.
                                super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                                ._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (bVar1) {
      this_00 = this->status_;
      total = Plan::command_edge_count(&this->plan_);
      BuildStatus::PlanHasTotalEdges(this_00,total);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  DyndepFile::~DyndepFile((DyndepFile *)local_58);
  return this_local._7_1_;
}

Assistant:

bool Builder::LoadDyndeps(Node* node, string* err) {
  status_->BuildLoadDyndeps();

  // Load the dyndep information provided by this node.
  DyndepFile ddf;
  if (!scan_.LoadDyndeps(node, &ddf, err))
    return false;

  // Update the build plan to account for dyndep modifications to the graph.
  if (!plan_.DyndepsLoaded(&scan_, node, ddf, err))
    return false;

  // New command edges may have been added to the plan.
  status_->PlanHasTotalEdges(plan_.command_edge_count());

  return true;
}